

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

duration __thiscall wallet::CWallet::ScanningDuration(CWallet *this)

{
  long lVar1;
  long lVar2;
  duration dVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->fScanningWallet)._M_base._M_i & 1U) == 0) {
    dVar3.__r = 0;
  }
  else {
    lVar2 = std::chrono::_V2::steady_clock::now();
    dVar3.__r = lVar2 - (this->m_scanning_start)._M_i.__d.__r;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (duration)dVar3.__r;
  }
  __stack_chk_fail();
}

Assistant:

SteadyClock::duration ScanningDuration() const { return fScanningWallet ? SteadyClock::now() - m_scanning_start.load() : SteadyClock::duration{}; }